

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel(IntVar *x,IntRelType t,int c)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  int in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  BoolView *in_stack_fffffffffffffed8;
  IntVar *in_stack_fffffffffffffee0;
  IntVar *in_stack_fffffffffffffee8;
  FILE *__stream;
  IRR *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar4;
  byte local_e1;
  byte local_c9;
  byte local_b1;
  byte local_81;
  anon_union_8_2_743a5d44_for_Reason_0 local_78;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  anon_union_8_2_743a5d44_for_Reason_0 local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_60 [9];
  anon_union_8_2_743a5d44_for_Reason_0 local_18;
  int local_10;
  long *local_8;
  
  local_10 = in_EDX;
  local_8 = in_RDI;
  switch(in_ESI) {
  case 0:
    bVar1 = IntVar::setValNotR((IntVar *)
                               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                               in_stack_fffffffffffffef8);
    local_81 = 0;
    if (bVar1) {
      Reason::Reason((Reason *)&local_18,(Clause *)0x0);
      local_81 = (**(code **)(*local_8 + 0x80))(local_8,(long)local_10,local_18._pt,1);
      local_81 = local_81 ^ 0xff;
    }
    if ((local_81 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    break;
  case 1:
    BoolView::BoolView((BoolView *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    IRR::IRR(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (IntRelType)((ulong)in_stack_fffffffffffffee0 >> 0x20),(int)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
    vec<IRR>::push((vec<IRR> *)in_stack_fffffffffffffef0,(IRR *)in_stack_fffffffffffffee8);
    IRR::~IRR((IRR *)0x276a72);
    BoolView::~BoolView((BoolView *)0x276a7f);
    break;
  case 2:
    bVar1 = IntVar::setMaxNotR(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
    local_b1 = 0;
    if (bVar1) {
      Reason::Reason((Reason *)local_60,(Clause *)0x0);
      local_b1 = (**(code **)(*local_8 + 0x78))(local_8,(long)local_10,local_60[0]._pt,1);
      local_b1 = local_b1 ^ 0xff;
    }
    if ((local_b1 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    break;
  case 3:
    bVar1 = IntVar::setMaxNotR(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
    local_c9 = 0;
    if (bVar1) {
      Reason::Reason((Reason *)&local_68,(Clause *)0x0);
      local_c9 = (**(code **)(*local_8 + 0x78))(local_8,(long)(local_10 + -1),local_68._pt,1);
      local_c9 = local_c9 ^ 0xff;
    }
    if ((local_c9 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    break;
  case 4:
    bVar1 = IntVar::setMinNotR(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
    local_e1 = 0;
    if (bVar1) {
      Reason::Reason((Reason *)&local_70,(Clause *)0x0);
      local_e1 = (**(code **)(*local_8 + 0x70))(local_8,(long)local_10,local_70._pt,1);
      local_e1 = local_e1 ^ 0xff;
    }
    if ((local_e1 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    break;
  case 5:
    bVar1 = IntVar::setMinNotR(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
    bVar4 = 0;
    if (bVar1) {
      lVar2 = (long)(local_10 + 1);
      Reason::Reason((Reason *)&local_78,(Clause *)0x0);
      bVar4 = (**(code **)(*local_8 + 0x70))(local_8,lVar2,local_78._pt,1);
      bVar4 = bVar4 ^ 0xff;
    }
    if ((bVar4 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    break;
  default:
    __stream = _stderr;
    pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                       ,0x2f);
      pcVar3 = pcVar3 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar3,0x16b);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  return;
}

Assistant:

void int_rel(IntVar* x, IntRelType t, int c) {
	switch (t) {
		case IRT_EQ:
			TL_SET(x, setVal, c);
			break;
		case IRT_NE:
			ircs.push(IRR(x, t, c, bv_true));
			break;
		case IRT_LE:
			TL_SET(x, setMax, c);
			break;
		case IRT_LT:
			TL_SET(x, setMax, c - 1);
			break;
		case IRT_GE:
			TL_SET(x, setMin, c);
			break;
		case IRT_GT:
			TL_SET(x, setMin, c + 1);
			break;
		default:
			NEVER;
	}
}